

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O0

void __thiscall Response::Response(Response *this,Request *request,path *resolve_path)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  Response *in_RDX;
  long in_RSI;
  Response *in_RDI;
  path filepath;
  path *in_stack_fffffffffffffb38;
  path *in_stack_fffffffffffffb40;
  undefined7 in_stack_fffffffffffffb48;
  undefined1 in_stack_fffffffffffffb4f;
  path *in_stack_fffffffffffffb50;
  basic_ifstream<char,_std::char_traits<char>_> *this_00;
  undefined8 in_stack_fffffffffffffb58;
  int code;
  undefined4 in_stack_fffffffffffffb60;
  undefined1 in_stack_fffffffffffffb64;
  undefined1 in_stack_fffffffffffffb65;
  undefined1 in_stack_fffffffffffffb66;
  format in_stack_fffffffffffffb67;
  string_type *__source;
  allocator<char> *in_stack_fffffffffffffb70;
  path *this_01;
  char *in_stack_fffffffffffffb78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb80;
  path *this_02;
  format fVar8;
  string *__source_00;
  path *this_03;
  Response *this_04;
  undefined1 local_438 [576];
  string local_1f8 [32];
  path local_1d8 [5];
  undefined4 local_ec;
  path local_c0;
  string local_98 [32];
  string local_78 [32];
  path local_58;
  allocator<char> local_2e;
  undefined1 local_2d [29];
  long local_10;
  
  code = (int)((ulong)in_stack_fffffffffffffb58 >> 0x20);
  this_04 = in_RDI;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  std::allocator<char>::~allocator((allocator<char> *)(local_2d + 0x14));
  __source_00 = &in_RDI->server;
  this_03 = (path *)local_2d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  std::allocator<char>::~allocator((allocator<char> *)local_2d);
  this_02 = (path *)&in_RDI->connection;
  fVar8 = (format)((ulong)&local_2e >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  std::allocator<char>::~allocator(&local_2e);
  in_RDI->content_length = 0;
  Status::Status((Status *)
                 CONCAT17(in_stack_fffffffffffffb67,
                          CONCAT16(in_stack_fffffffffffffb66,
                                   CONCAT15(in_stack_fffffffffffffb65,
                                            CONCAT14(in_stack_fffffffffffffb64,
                                                     in_stack_fffffffffffffb60)))),code);
  get_date_abi_cxx11_();
  __source = &in_RDI->content_type;
  std::__cxx11::string::string((string *)__source);
  this_01 = (path *)&in_RDI->body;
  std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>::shared_ptr
            ((shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_> *)
             in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  std::__cxx11::string::string(local_98,(string *)(local_10 + 0x20));
  prepare_url(in_RDX,&this_03->_M_pathname);
  std::filesystem::__cxx11::path::path(this_01,__source,in_stack_fffffffffffffb67);
  std::filesystem::__cxx11::path::operator+=((path *)in_RDX,&local_58);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffb40);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_98);
  std::filesystem::__cxx11::path::path
            (in_stack_fffffffffffffb50,
             (path *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
  lVar5 = std::__cxx11::string::find((char *)(local_10 + 0x20),0x113662);
  if (lVar5 == -1) {
    uVar1 = std::filesystem::exists(in_stack_fffffffffffffb40);
    if ((bool)uVar1) {
      uVar6 = std::filesystem::__cxx11::path::has_filename();
      if ((uVar6 & 1) == 0) {
        std::filesystem::__cxx11::path::path<char[11],std::filesystem::__cxx11::path>
                  (this_03,(char (*) [11])__source_00,fVar8);
        std::filesystem::__cxx11::path::replace_filename(&local_c0);
        std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffb40);
      }
      uVar2 = std::filesystem::exists(in_stack_fffffffffffffb40);
      if ((bool)uVar2) {
        uVar3 = std::operator!=(&in_stack_fffffffffffffb40->_M_pathname,
                                (char *)in_stack_fffffffffffffb38);
        if (((bool)uVar3) &&
           (in_stack_fffffffffffffb64 =
                 std::operator!=(&in_stack_fffffffffffffb40->_M_pathname,
                                 (char *)in_stack_fffffffffffffb38), (bool)in_stack_fffffffffffffb64
           )) {
          Status::Status((Status *)
                         CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(
                                                  in_stack_fffffffffffffb64,
                                                  in_stack_fffffffffffffb60)))),code);
          Status::operator=((Status *)in_stack_fffffffffffffb40,(Status *)in_stack_fffffffffffffb38)
          ;
          Status::~Status((Status *)0x110add);
          local_ec = 1;
        }
        else {
          sVar7 = std::filesystem::file_size(&local_c0);
          in_RDI->content_length = sVar7;
          Status::Status((Status *)
                         CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(
                                                  in_stack_fffffffffffffb64,
                                                  in_stack_fffffffffffffb60)))),(int)(sVar7 >> 0x20)
                        );
          this_00 = (basic_ifstream<char,_std::char_traits<char>_> *)&local_1d8[0]._M_cmpts;
          Status::operator=((Status *)in_stack_fffffffffffffb40,(Status *)in_stack_fffffffffffffb38)
          ;
          Status::~Status((Status *)0x110b48);
          std::filesystem::__cxx11::path::extension(this_02);
          std::filesystem::__cxx11::path::operator_cast_to_string(in_stack_fffffffffffffb38);
          parse_mime(this_04,&in_RDI->protocol);
          in_stack_fffffffffffffb40 = local_1d8;
          std::__cxx11::string::operator=
                    ((string *)&in_RDI->content_type,(string *)in_stack_fffffffffffffb40);
          std::__cxx11::string::~string((string *)in_stack_fffffffffffffb40);
          std::__cxx11::string::~string(local_1f8);
          std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffb40);
          bVar4 = std::operator==(&in_stack_fffffffffffffb40->_M_pathname,
                                  (char *)in_stack_fffffffffffffb38);
          if (bVar4) {
            std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
                      (this_00,(path *)CONCAT17(bVar4,in_stack_fffffffffffffb48),
                       (openmode)((ulong)in_stack_fffffffffffffb40 >> 0x20));
            std::make_shared<std::ifstream,std::ifstream>
                      ((basic_ifstream<char,_std::char_traits<char>_> *)__source);
            std::shared_ptr<std::istream>::operator=
                      ((shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_> *)
                       in_stack_fffffffffffffb40,
                       (shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                       in_stack_fffffffffffffb38);
            std::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>::~shared_ptr
                      ((shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_> *)0x110c54);
            std::ifstream::~ifstream(local_438);
            local_ec = 1;
          }
          else {
            local_ec = 0;
          }
        }
      }
      else {
        Status::Status((Status *)
                       CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffb65,
                                                              CONCAT14(in_stack_fffffffffffffb64,
                                                                       in_stack_fffffffffffffb60))))
                       ,code);
        Status::operator=((Status *)in_stack_fffffffffffffb40,(Status *)in_stack_fffffffffffffb38);
        Status::~Status((Status *)0x110a4e);
        local_ec = 1;
      }
    }
    else {
      Status::Status((Status *)
                     CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffb66,
                                             CONCAT15(in_stack_fffffffffffffb65,
                                                      CONCAT14(in_stack_fffffffffffffb64,
                                                               in_stack_fffffffffffffb60)))),code);
      Status::operator=((Status *)in_stack_fffffffffffffb40,(Status *)in_stack_fffffffffffffb38);
      Status::~Status((Status *)0x110972);
      local_ec = 1;
    }
  }
  else {
    Status::Status((Status *)
                   CONCAT17(in_stack_fffffffffffffb67,
                            CONCAT16(in_stack_fffffffffffffb66,
                                     CONCAT15(in_stack_fffffffffffffb65,
                                              CONCAT14(in_stack_fffffffffffffb64,
                                                       in_stack_fffffffffffffb60)))),code);
    Status::operator=((Status *)in_stack_fffffffffffffb40,(Status *)in_stack_fffffffffffffb38);
    Status::~Status((Status *)0x1107cc);
    local_ec = 1;
  }
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffb40);
  return;
}

Assistant:

Response::Response(const Request& request, fs::path resolve_path) :
            protocol("HTTP/1.1"),
            server("Apache/2.2.8 (Ubuntu) mod_ssl/2.2.8 OpenSSL/0.9.8g"),
            connection("close"),
            content_length(0),
            date(get_date()),
            body(nullptr) {

    resolve_path += fs::path(prepare_url(request.path));
    fs::path filepath = resolve_path;

    if (request.path.find("../") != std::string::npos) {
        status = Response::Status(403);
        return;
    }
    if (!fs::exists(filepath)) {
        status = Response::Status(404);
        return;
    }

    if (!filepath.has_filename()) {
        filepath.replace_filename("index.html");
    } 
    if (!fs::exists(filepath)) {
        status = Response::Status(403);
        return;
    }

    if (request.method != "HEAD" && request.method != "GET") {
        status = Response::Status(405);
        return;
    }
    {   
        content_length = fs::file_size(filepath);
    }

    status = Response::Status(200);
    content_type = parse_mime(filepath.extension());
    if (request.method == "GET") {
        body = std::make_shared<std::ifstream>(std::ifstream(filepath));
        return;
    }
}